

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O1

int __thiscall Heuristics::evaluateStateAstar(Heuristics *this,Table currentState)

{
  Cell *pCVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Table *pTVar8;
  int i;
  long lVar9;
  int j;
  long lVar10;
  
  lVar9 = 0;
  pTVar8 = &currentState;
  iVar3 = 0;
  iVar4 = 0;
  do {
    lVar10 = 0;
    do {
      pCVar1 = pTVar8->table[0] + lVar10;
      cVar2 = Cell::getNumber(pCVar1);
      if (cVar2 != ' ') {
        cVar2 = Cell::getNumber(pCVar1);
        iVar3 = (int)cVar2;
        iVar5 = iVar3 + -0x31;
        iVar6 = ((int)((ulong)((long)iVar5 * 0x55555555) >> 0x20) - iVar3) + 0x31;
        iVar7 = ((iVar6 >> 1) - (iVar6 >> 0x1f)) + (int)lVar9;
        iVar6 = -iVar7;
        if (0 < iVar7) {
          iVar6 = iVar7;
        }
        iVar7 = ((iVar5 / 3) * 3 - iVar5) + (int)lVar10;
        iVar5 = -iVar7;
        if (0 < iVar7) {
          iVar5 = iVar7;
        }
        iVar3 = iVar3 + -0x30;
        iVar4 = iVar5 + iVar4 + iVar6;
      }
      iVar6 = iVar3 + -1;
      iVar5 = ((int)((ulong)((long)iVar6 * 0x55555555) >> 0x20) - iVar3) + 1;
      iVar7 = ((iVar5 >> 1) - (iVar5 >> 0x1f)) + (int)lVar9;
      iVar5 = -iVar7;
      if (0 < iVar7) {
        iVar5 = iVar7;
      }
      iVar7 = ((iVar6 / 3) * 3 - iVar6) + (int)lVar10;
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      iVar4 = iVar4 + iVar6 + iVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar9 = lVar9 + 1;
    pTVar8 = (Table *)(pTVar8->table + 1);
  } while (lVar9 != 3);
  lVar9 = 0;
  pTVar8 = &currentState;
  do {
    lVar10 = 0;
    do {
      pCVar1 = pTVar8->table[0] + lVar10;
      cVar2 = Cell::getNumber(pCVar1);
      if (cVar2 != ' ') {
        cVar2 = Cell::getNumber(pCVar1);
        iVar3 = (int)cVar2;
        iVar5 = iVar3 + -0x31;
        iVar6 = ((int)((ulong)((long)iVar5 * 0x55555555) >> 0x20) - iVar3) + 0x31;
        iVar7 = ((iVar6 >> 1) - (iVar6 >> 0x1f)) + (int)lVar9;
        iVar6 = -iVar7;
        if (0 < iVar7) {
          iVar6 = iVar7;
        }
        iVar7 = ((iVar5 / 3) * 3 - iVar5) + (int)lVar10;
        iVar5 = -iVar7;
        if (0 < iVar7) {
          iVar5 = iVar7;
        }
        iVar3 = iVar3 + -0x30;
        iVar4 = iVar5 + iVar4 + iVar6;
      }
      iVar6 = iVar3 + -1;
      iVar5 = ((int)((ulong)((long)iVar6 * 0x55555555) >> 0x20) - iVar3) + 1;
      iVar7 = ((iVar5 >> 1) - (iVar5 >> 0x1f)) + (int)lVar9;
      iVar5 = -iVar7;
      if (0 < iVar7) {
        iVar5 = iVar7;
      }
      iVar7 = ((iVar6 / 3) * 3 - iVar6) + (int)lVar10;
      iVar6 = -iVar7;
      if (0 < iVar7) {
        iVar6 = iVar7;
      }
      iVar4 = iVar4 + iVar6 + iVar5;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar9 = lVar9 + 1;
    pTVar8 = (Table *)(pTVar8->table + 1);
  } while (lVar9 != 3);
  return iVar4;
}

Assistant:

int Heuristics::evaluateStateAstar(Table currentState) {
    int distance = 0;
    Table initialTable = Table();
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
            distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
        }
    }
    return distance;
}